

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

QByteArray * qCleanupFuncinfo(QByteArray *__return_storage_ptr__,QByteArray info)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  qsizetype qVar10;
  qsizetype qVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong __length;
  QByteArray *in_RSI;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *__old_val;
  long in_FS_OFFSET;
  QByteArrayView before;
  QByteArrayView after;
  QByteArrayView needle;
  QByteArrayView needle_00;
  QByteArrayView needle_01;
  QByteArrayView needle_02;
  QByteArrayView haystack;
  QByteArrayView haystack_00;
  QByteArrayView haystack_01;
  QByteArrayView haystack_02;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = (in_RSI->d).size;
  if (lVar8 == 0) {
    pDVar5 = (in_RSI->d).d;
    pcVar9 = (in_RSI->d).ptr;
    (in_RSI->d).d = (Data *)0x0;
    (in_RSI->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).d = pDVar5;
    (__return_storage_ptr__->d).ptr = pcVar9;
    qVar10 = 0;
    goto LAB_00210adc;
  }
  pcVar9 = (in_RSI->d).ptr;
  if (((pcVar9[lVar8 + -1] == ']') && (*pcVar9 != '+')) && (*pcVar9 != '-')) {
    pcVar15 = (char *)(lVar8 + -1);
    do {
      if (pcVar15 == (char *)0x1) goto LAB_002106a0;
      pcVar1 = pcVar15 + -1;
      pcVar17 = pcVar9 + -1 + (long)pcVar15;
      pcVar15 = pcVar1;
    } while (*pcVar17 != '[');
    QByteArray::truncate(in_RSI,pcVar1,(__off_t)pcVar1);
    lVar8 = (in_RSI->d).size;
LAB_002106a0:
    if ((lVar8 != 0) && ((in_RSI->d).ptr[lVar8 + -1] == ' ')) {
      QByteArray::chop(in_RSI,1);
    }
  }
  before.m_data = "operator ";
  before.m_size = 9;
  after.m_data = "operator";
  after.m_size = 8;
  QByteArray::replace(in_RSI,before,after);
  for (pcVar9 = (char *)QByteArray::lastIndexOf(in_RSI,')',-1); pcVar9 != (char *)0xffffffffffffffff
      ; pcVar9 = (char *)QByteArray::lastIndexOf(in_RSI,')',(qsizetype)pcVar9)) {
    qVar10 = QByteArray::indexOf(in_RSI,'>',(qsizetype)pcVar9);
    if ((qVar10 == -1) && (qVar10 = QByteArray::indexOf(in_RSI,':',(qsizetype)pcVar9), qVar10 == -1)
       ) {
      if (pcVar9 == (char *)0x1) break;
      uVar7 = 1;
      do {
        pcVar15 = pcVar9;
        __length = uVar7;
        cVar2 = ((in_RSI->d).ptr + -1)[(long)pcVar15];
        iVar12 = -(uint)(cVar2 == '(');
        if (cVar2 == ')') {
          iVar12 = 1;
        }
        uVar13 = iVar12 + (int)__length;
        pcVar9 = pcVar15 + -1;
      } while ((pcVar15 != (char *)0x2) && (uVar7 = (ulong)uVar13, uVar13 != 0));
      if (uVar13 != 0) break;
      QByteArray::truncate(in_RSI,pcVar9,__length);
      pcVar1 = (in_RSI->d).ptr;
      if (((pcVar1 + -1)[(long)pcVar9] != ')') ||
         (needle.m_data = "operator()", needle.m_size = 10, haystack.m_data = pcVar1,
         haystack.m_size = (in_RSI->d).size, qVar10 = QtPrivate::findByteArray(haystack,0,needle),
         (char *)(qVar10 + 10) == pcVar9)) {
        pcVar17 = pcVar15 + -2;
        if ((long)pcVar9 < 1) goto LAB_00210949;
        bVar3 = (pcVar1 + -1)[(long)pcVar9];
        if (bVar3 < 0x3d) {
          if (bVar3 == 0x29) {
            qVar10 = (in_RSI->d).size;
            pcVar16 = "operator()";
LAB_002108c8:
            needle_02.m_data = pcVar16;
            needle_02.m_size = 10;
            haystack_02.m_data = pcVar1;
            haystack_02.m_size = qVar10;
            qVar10 = QtPrivate::findByteArray(haystack_02,0,needle_02);
            if ((char *)(qVar10 + 10) == pcVar9) goto LAB_002108db;
          }
          else if (bVar3 == 0x3c) {
            qVar10 = (in_RSI->d).size;
            pcVar16 = "operator<";
LAB_00210863:
            needle_00.m_data = pcVar16;
            needle_00.m_size = 9;
            haystack_00.m_data = pcVar1;
            haystack_00.m_size = qVar10;
            qVar10 = QtPrivate::findByteArray(haystack_00,0,needle_00);
            if ((char *)(qVar10 + 9) == pcVar9) {
              pcVar17 = pcVar15 + -3;
              goto LAB_002108df;
            }
          }
        }
        else if (bVar3 == 0x3d) {
          qVar10 = (in_RSI->d).size;
          needle_01.m_data = "operator<=";
          needle_01.m_size = 10;
          haystack_01.m_data = pcVar1;
          haystack_01.m_size = qVar10;
          qVar11 = QtPrivate::findByteArray(haystack_01,0,needle_01);
          if ((char *)(qVar11 + 10) != pcVar9) {
            pcVar16 = "operator>=";
            goto LAB_002108c8;
          }
LAB_002108db:
          pcVar17 = pcVar15 + -4;
LAB_002108df:
          if ((long)pcVar17 < 0) goto LAB_00210949;
        }
        else if (bVar3 == 0x3e) {
          qVar10 = (in_RSI->d).size;
          pcVar16 = "operator>";
          goto LAB_00210863;
        }
        iVar12 = 0;
        iVar14 = 0;
        goto LAB_002108eb;
      }
      QByteArray::indexOf(in_RSI,'(',0);
      QByteArray::remove(in_RSI,(char *)0x0);
      QByteArray::chop(in_RSI,1);
    }
    else {
      pcVar9 = pcVar9 + -1;
    }
  }
  goto LAB_00210ac2;
LAB_002108eb:
  do {
    if ((iVar12 < 0) || (iVar14 < 0)) {
      pDVar5 = (in_RSI->d).d;
      (in_RSI->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).d = pDVar5;
      (in_RSI->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).ptr = pcVar1;
      qVar10 = (in_RSI->d).size;
      (in_RSI->d).size = 0;
      goto LAB_00210adc;
    }
    bVar3 = pcVar1[(long)pcVar17];
    if (bVar3 < 0x3c) {
      if (bVar3 == 0x28) {
        iVar12 = iVar12 + -1;
      }
      else if (bVar3 == 0x29) {
        iVar12 = iVar12 + 1;
      }
      else {
LAB_00210923:
        if ((bVar3 == 0x20) && (iVar14 == 0 && iVar12 == 0)) goto LAB_00210949;
      }
    }
    else if (bVar3 == 0x3c) {
      iVar14 = iVar14 + -1;
    }
    else {
      if (bVar3 != 0x3e) goto LAB_00210923;
      iVar14 = iVar14 + 1;
    }
    bVar6 = 0 < (long)pcVar17;
    pcVar17 = pcVar17 + -1;
  } while (bVar6);
  pcVar17 = (char *)0xffffffffffffffff;
LAB_00210949:
  QByteArray::mid(&local_58,in_RSI,(qsizetype)(pcVar17 + 1),-1);
  pQVar4 = &((in_RSI->d).d)->super_QArrayData;
  pcVar9 = (in_RSI->d).ptr;
  (in_RSI->d).d = local_58.d.d;
  (in_RSI->d).ptr = local_58.d.ptr;
  qVar10 = (in_RSI->d).size;
  (in_RSI->d).size = local_58.d.size;
  local_58.d.d = (Data *)pQVar4;
  local_58.d.ptr = pcVar9;
  local_58.d.size = qVar10;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,1,0x10);
    }
  }
  while ((cVar2 = *(in_RSI->d).ptr, cVar2 == '&' || (cVar2 == '*'))) {
    QByteArray::mid(&local_58,in_RSI,1,-1);
    pQVar4 = &((in_RSI->d).d)->super_QArrayData;
    pcVar9 = (in_RSI->d).ptr;
    (in_RSI->d).d = local_58.d.d;
    (in_RSI->d).ptr = local_58.d.ptr;
    qVar10 = (in_RSI->d).size;
    (in_RSI->d).size = local_58.d.size;
    local_58.d.d = (Data *)pQVar4;
    local_58.d.ptr = pcVar9;
    local_58.d.size = qVar10;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,1,0x10);
      }
    }
  }
  pcVar9 = (char *)QByteArray::lastIndexOf(in_RSI,'>',-1);
  while ((pcVar9 != (char *)0xffffffffffffffff &&
         (qVar10 = QByteArray::indexOf(in_RSI,'<',0), qVar10 != -1))) {
    if (pcVar9 == (char *)0x1) {
      pcVar15 = (char *)0x1;
    }
    else {
      iVar12 = 1;
      do {
        cVar2 = ((in_RSI->d).ptr + -1)[(long)pcVar9];
        if (cVar2 == '<') {
          iVar12 = iVar12 + -1;
        }
        else if (cVar2 == '>') {
          iVar12 = iVar12 + 1;
        }
        pcVar15 = pcVar9 + -1;
      } while ((pcVar9 != (char *)0x2) && (pcVar9 = pcVar15, iVar12 != 0));
    }
    QByteArray::remove(in_RSI,pcVar15);
    pcVar9 = (char *)QByteArray::lastIndexOf(in_RSI,'>',-1);
  }
LAB_00210ac2:
  pDVar5 = (in_RSI->d).d;
  pcVar9 = (in_RSI->d).ptr;
  (in_RSI->d).d = (Data *)0x0;
  (in_RSI->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).d = pDVar5;
  (__return_storage_ptr__->d).ptr = pcVar9;
  qVar10 = (in_RSI->d).size;
  (in_RSI->d).size = 0;
LAB_00210adc:
  (__return_storage_ptr__->d).size = qVar10;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Q_AUTOTEST_EXPORT QByteArray qCleanupFuncinfo(QByteArray info)
{
    // Strip the function info down to the base function name
    // note that this throws away the template definitions,
    // the parameter types (overloads) and any const/volatile qualifiers.

    if (info.isEmpty())
        return info;

    qsizetype pos;

    // Skip trailing [with XXX] for templates (gcc), but make
    // sure to not affect Objective-C message names.
    pos = info.size() - 1;
    if (info.endsWith(']') && !(info.startsWith('+') || info.startsWith('-'))) {
        while (--pos) {
          if (info.at(pos) == '[') {
              info.truncate(pos);
              break;
          }
        }
        if (info.endsWith(' ')) {
          info.chop(1);
        }
    }

    // operator names with '(', ')', '<', '>' in it
    static const char operator_call[] = "operator()";
    static const char operator_lessThan[] = "operator<";
    static const char operator_greaterThan[] = "operator>";
    static const char operator_lessThanEqual[] = "operator<=";
    static const char operator_greaterThanEqual[] = "operator>=";

    // canonize operator names
    info.replace("operator ", "operator");

    pos = -1;
    // remove argument list
    forever {
        int parencount = 0;
        pos = info.lastIndexOf(')', pos);
        if (pos == -1) {
            // Don't know how to parse this function name
            return info;
        }
        if (info.indexOf('>', pos) != -1
                || info.indexOf(':', pos) != -1) {
            // that wasn't the function argument list.
            --pos;
            continue;
        }

        // find the beginning of the argument list
        --pos;
        ++parencount;
        while (pos && parencount) {
            if (info.at(pos) == ')')
                ++parencount;
            else if (info.at(pos) == '(')
                --parencount;
            --pos;
        }
        if (parencount != 0)
            return info;

        info.truncate(++pos);

        if (info.at(pos - 1) == ')') {
            if (info.indexOf(operator_call) == pos - qsizetype(strlen(operator_call)))
                break;

            // this function returns a pointer to a function
            // and we matched the arguments of the return type's parameter list
            // try again
            info.remove(0, info.indexOf('('));
            info.chop(1);
            continue;
        } else {
            break;
        }
    }